

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

Value * __thiscall choc::value::Value::operator=(Value *this,ValueView *source)

{
  pointer __dest;
  pointer puVar1;
  pointer pcVar2;
  bool bVar3;
  size_t __new_size;
  
  __new_size = Type::getValueDataSize(&source->type);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->packedData,__new_size);
  Type::operator=(&(this->value).type,&source->type);
  __dest = (this->packedData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->packedData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->value).data = __dest;
  memcpy(__dest,source->data,(long)puVar1 - (long)__dest);
  pcVar2 = (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar2) {
    (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar2;
  }
  if (source->stringDictionary != (StringDictionary *)0x0) {
    bVar3 = Type::usesStrings(&source->type);
    if (bVar3) {
      importStringHandles(this,&this->value,source->stringDictionary);
    }
  }
  return this;
}

Assistant:

inline Value& Value::operator= (const ValueView& source)
{
    packedData.resize (source.getType().getValueDataSize());
    value.type = source.type;
    value.data = packedData.data();
    memcpy (value.data, source.getRawData(), getRawDataSize());
    dictionary.strings.clear();

    if (source.stringDictionary != nullptr && source.getType().usesStrings())
        importStringHandles (value, *source.stringDictionary);

    return *this;
}